

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

ConcatParameter * __thiscall caffe::V1LayerParameter::mutable_concat_param(V1LayerParameter *this)

{
  ConcatParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_concat_param(this);
  if (this->concat_param_ == (ConcatParameter *)0x0) {
    this_00 = (ConcatParameter *)operator_new(0x20);
    ConcatParameter::ConcatParameter(this_00);
    this->concat_param_ = this_00;
  }
  return this->concat_param_;
}

Assistant:

inline ::caffe::ConcatParameter* V1LayerParameter::mutable_concat_param() {
  set_has_concat_param();
  if (concat_param_ == NULL) {
    concat_param_ = new ::caffe::ConcatParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.concat_param)
  return concat_param_;
}